

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# doctest.h
# Opt level: O0

void __thiscall
doctest::anon_unknown_15::XmlReporter::test_case_end(XmlReporter *this,CurrentTestCaseStats *st)

{
  XmlWriter *pXVar1;
  allocator<char> local_111;
  string local_110;
  allocator<char> local_e9;
  string local_e8;
  allocator<char> local_c1;
  string local_c0;
  allocator<char> local_99;
  string local_98;
  int local_78;
  allocator<char> local_71;
  string local_70;
  allocator<char> local_39;
  string local_38;
  CurrentTestCaseStats *local_18;
  CurrentTestCaseStats *st_local;
  XmlReporter *this_local;
  
  local_18 = st;
  st_local = (CurrentTestCaseStats *)this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_38,"OverallResultsAsserts",&local_39);
  pXVar1 = XmlWriter::startElement(&this->xml,&local_38);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_70,"successes",&local_71);
  local_78 = local_18->numAssertsCurrentTest - local_18->numAssertsFailedCurrentTest;
  pXVar1 = XmlWriter::writeAttribute<int>(pXVar1,&local_70,&local_78);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_98,"failures",&local_99);
  pXVar1 = XmlWriter::writeAttribute<int>(pXVar1,&local_98,&local_18->numAssertsFailedCurrentTest);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_c0,"test_case_success",&local_c1);
  XmlWriter::writeAttribute(pXVar1,&local_c0,(bool)(local_18->testCaseSuccess & 1));
  std::__cxx11::string::~string((string *)&local_c0);
  std::allocator<char>::~allocator(&local_c1);
  std::__cxx11::string::~string((string *)&local_98);
  std::allocator<char>::~allocator(&local_99);
  std::__cxx11::string::~string((string *)&local_70);
  std::allocator<char>::~allocator(&local_71);
  std::__cxx11::string::~string((string *)&local_38);
  std::allocator<char>::~allocator(&local_39);
  if ((this->opt->duration & 1U) != 0) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_e8,"duration",&local_e9);
    XmlWriter::writeAttribute<double>(&this->xml,&local_e8,&local_18->seconds);
    std::__cxx11::string::~string((string *)&local_e8);
    std::allocator<char>::~allocator(&local_e9);
  }
  if (this->tc->m_expected_failures != 0) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_110,"expected_failures",&local_111);
    XmlWriter::writeAttribute<int>(&this->xml,&local_110,&this->tc->m_expected_failures);
    std::__cxx11::string::~string((string *)&local_110);
    std::allocator<char>::~allocator(&local_111);
  }
  XmlWriter::endElement(&this->xml);
  XmlWriter::endElement(&this->xml);
  return;
}

Assistant:

void test_case_end(const CurrentTestCaseStats& st) override {
            xml.startElement("OverallResultsAsserts")
                    .writeAttribute("successes",
                                    st.numAssertsCurrentTest - st.numAssertsFailedCurrentTest)
                    .writeAttribute("failures", st.numAssertsFailedCurrentTest)
                    .writeAttribute("test_case_success", st.testCaseSuccess);
            if(opt.duration)
                xml.writeAttribute("duration", st.seconds);
            if(tc->m_expected_failures)
                xml.writeAttribute("expected_failures", tc->m_expected_failures);
            xml.endElement();

            xml.endElement();
        }